

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

void __thiscall
onmt::Tokenizer::Tokenizer
          (Tokenizer *this,Mode mode,SubwordEncoder *subword_encoder,int flags,string *joiner)

{
  shared_ptr<const_onmt::SubwordEncoder> sStack_28;
  
  (this->super_ITokenizer)._vptr_ITokenizer = (_func_int **)&PTR__Tokenizer_003b60a8;
  Options::Options(&this->_options,mode,flags,joiner);
  (this->_subword_encoder).
  super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_subword_encoder).
  super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Options::validate(&this->_options);
  std::__shared_ptr<onmt::SubwordEncoder_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<onmt::SubwordEncoder_const,void>
            ((__shared_ptr<onmt::SubwordEncoder_const,(__gnu_cxx::_Lock_policy)2> *)&sStack_28,
             subword_encoder);
  set_subword_encoder(this,&sStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_28.super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

Tokenizer::Tokenizer(Mode mode,
                       const SubwordEncoder* subword_encoder,
                       int flags,
                       const std::string& joiner)
    : _options(mode, flags, joiner)
  {
    _options.validate();
    set_subword_encoder(std::shared_ptr<const SubwordEncoder>(subword_encoder));
  }